

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STTx.cpp
# Opt level: O0

string * __thiscall
jbcoin::STTx::getMetaSQL
          (string *__return_storage_ptr__,STTx *this,uint32_t inLedger,string *escapedMetaData)

{
  Serializer local_68;
  undefined1 local_40 [8];
  Serializer s;
  string *escapedMetaData_local;
  uint32_t inLedger_local;
  STTx *this_local;
  
  s.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)escapedMetaData;
  Serializer::Serializer((Serializer *)local_40,0x100);
  STObject::add(&this->super_STObject,(Serializer *)local_40);
  Serializer::Serializer(&local_68,(Serializer *)local_40);
  getMetaSQL(__return_storage_ptr__,this,&local_68,inLedger,'V',
             (string *)
             s.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  Serializer::~Serializer(&local_68);
  Serializer::~Serializer((Serializer *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string STTx::getMetaSQL (std::uint32_t inLedger,
                                               std::string const& escapedMetaData) const
{
    Serializer s;
    add (s);
    return getMetaSQL (s, inLedger, TXN_SQL_VALIDATED, escapedMetaData);
}